

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_tree.c
# Opt level: O0

int handle_number(void *ctx,char *string,size_t string_length)

{
  int iVar1;
  yajl_val ctx_00;
  char *pcVar2;
  int *piVar3;
  longlong lVar4;
  size_t in_RDX;
  uchar *in_RSI;
  long in_RDI;
  double dVar5;
  char *endptr;
  yajl_val v;
  undefined8 in_stack_ffffffffffffffc8;
  yajl_val v_00;
  uint length;
  uint local_4;
  
  ctx_00 = value_alloc((yajl_type)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  if (ctx_00 == (yajl_val)0x0) {
    if (*(long *)(in_RDI + 0x10) != 0) {
      snprintf(*(char **)(in_RDI + 0x10),*(size_t *)(in_RDI + 0x18),"Out of memory");
    }
    local_4 = 0;
  }
  else {
    pcVar2 = (char *)malloc(in_RDX + 1);
    (ctx_00->u).number.r = pcVar2;
    if ((ctx_00->u).number.r == (char *)0x0) {
      free(ctx_00);
      if (*(long *)(in_RDI + 0x10) != 0) {
        snprintf(*(char **)(in_RDI + 0x10),*(size_t *)(in_RDI + 0x18),"Out of memory");
      }
      local_4 = 0;
    }
    else {
      memcpy((ctx_00->u).number.r,in_RSI,in_RDX);
      (ctx_00->u).number.r[in_RDX] = '\0';
      (ctx_00->u).number.flags = 0;
      piVar3 = __errno_location();
      length = (uint)(in_RDX >> 0x20);
      *piVar3 = 0;
      strlen((ctx_00->u).number.r);
      lVar4 = yajl_parse_integer(in_RSI,length);
      (ctx_00->u).number.i = lVar4;
      piVar3 = __errno_location();
      if (*piVar3 == 0) {
        (ctx_00->u).number.flags = (ctx_00->u).number.flags | 1;
      }
      v_00 = (yajl_val)0x0;
      piVar3 = __errno_location();
      *piVar3 = 0;
      dVar5 = strtod((ctx_00->u).number.r,(char **)&stack0xffffffffffffffd0);
      (ctx_00->u).number.d = dVar5;
      piVar3 = __errno_location();
      if (((*piVar3 == 0) && (v_00 != (yajl_val)0x0)) && ((char)v_00->type == 0)) {
        (ctx_00->u).number.flags = (ctx_00->u).number.flags | 2;
      }
      iVar1 = context_add_value((context_t *)ctx_00,v_00);
      local_4 = (uint)(iVar1 == 0);
    }
  }
  return local_4;
}

Assistant:

static int handle_number (void *ctx, const char *string, size_t string_length)
{
    yajl_val v;
    char *endptr;

    v = value_alloc(yajl_t_number);
    if (v == NULL)
        RETURN_ERROR((context_t *) ctx, STATUS_ABORT, "Out of memory");

    v->u.number.r = malloc(string_length + 1);
    if (v->u.number.r == NULL)
    {
        free(v);
        RETURN_ERROR((context_t *) ctx, STATUS_ABORT, "Out of memory");
    }
    memcpy(v->u.number.r, string, string_length);
    v->u.number.r[string_length] = 0;

    v->u.number.flags = 0;

    errno = 0;
    v->u.number.i = yajl_parse_integer((const unsigned char *) v->u.number.r,
                                       strlen(v->u.number.r));
    if (errno == 0)
        v->u.number.flags |= YAJL_NUMBER_INT_VALID;

    endptr = NULL;
    errno = 0;
    v->u.number.d = strtod(v->u.number.r, &endptr);
    if ((errno == 0) && (endptr != NULL) && (*endptr == 0))
        v->u.number.flags |= YAJL_NUMBER_DOUBLE_VALID;

    return ((context_add_value(ctx, v) == 0) ? STATUS_CONTINUE : STATUS_ABORT);
}